

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::SectionStats::SectionStats(SectionStats *this,SectionStats *param_2)

{
  long in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__SectionStats_001f0950;
  SectionInfo::SectionInfo((SectionInfo *)this,(SectionInfo *)param_2);
  memcpy(in_RDI + 0xe,(void *)(in_RSI + 0x70),0x21);
  return;
}

Assistant:

SectionStats( SectionStats const& )              = default;